

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

void luckyCanonicizer(word *pInOut,word *pAux,word *pAux1,int nVars,char *pCanonPerm,char *tempArray
                     ,uint *p_uCanonPhase)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/lucky.c"
                  ,0x237,
                  "void luckyCanonicizer(word *, word *, word *, int, char *, char *, unsigned int *)"
                 );
  }
  do {
    iVar1 = minimalInitialFlip(pInOut,nVars,p_uCanonPhase);
    iVar2 = minimalFlip(pInOut,pAux,pAux1,nVars,p_uCanonPhase);
    iVar3 = minimalSwap(pInOut,pAux,pAux1,nVars,pCanonPerm,tempArray,p_uCanonPhase);
  } while (iVar3 != 0 || iVar2 + iVar1 != 0);
  return;
}

Assistant:

void luckyCanonicizer(word* pInOut, word* pAux, word* pAux1, int  nVars, char * pCanonPerm, char * tempArray, unsigned* p_uCanonPhase)
{
    int counter=1;
    assert( nVars <= 16 );
    while(counter>0 )   //  && cycles < 10 if we wanna limit cycles
    {
        counter=0;
        counter += minimalInitialFlip(pInOut, nVars, p_uCanonPhase);
        counter += minimalFlip(pInOut, pAux, pAux1, nVars, p_uCanonPhase);
        counter += minimalSwap(pInOut, pAux, pAux1, nVars, pCanonPerm, tempArray, p_uCanonPhase);   
    }
}